

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

z_crc_t multmodp(z_crc_t a,z_crc_t b)

{
  uint uVar1;
  z_crc_t p;
  z_crc_t m;
  uint uVar2;
  uint uVar3;
  
  p = 0;
  uVar2 = 0x80000000;
  while (((uVar2 & a) == 0 || (p = p ^ b, (uVar2 - 1 & a) != 0))) {
    uVar2 = uVar2 >> 1;
    uVar3 = b >> 1;
    uVar1 = b & 1;
    b = uVar3 ^ 0xedb88320;
    if (uVar1 == 0) {
      b = uVar3;
    }
  }
  return p;
}

Assistant:

local z_crc_t multmodp(a, b)
    z_crc_t a;
    z_crc_t b;
{
    z_crc_t m, p;

    m = (z_crc_t)1 << 31;
    p = 0;
    for (;;) {
        if (a & m) {
            p ^= b;
            if ((a & (m - 1)) == 0)
                break;
        }
        m >>= 1;
        b = b & 1 ? (b >> 1) ^ POLY : b >> 1;
    }
    return p;
}